

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O3

void BuildAndStoreHuffmanTree
               (uint32_t *histogram,size_t histogram_length,size_t alphabet_size,HuffmanTree *tree,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  size_t sVar1;
  HuffmanTree *tree_00;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  size_t local_68 [4];
  size_t *local_48;
  uint8_t *local_40;
  HuffmanTree *local_38;
  
  local_68[2] = 0;
  local_68[3] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  if (histogram_length == 0) {
    uVar8 = 0;
  }
  else {
    sVar2 = 0;
    uVar8 = 0;
    do {
      if (histogram[sVar2] != 0) {
        if (uVar8 < 4) {
          local_68[uVar8] = sVar2;
        }
        else if (uVar8 != 4) break;
        uVar8 = uVar8 + 1;
      }
      sVar2 = sVar2 + 1;
    } while (histogram_length != sVar2);
  }
  uVar5 = alphabet_size - 1;
  uVar4 = 0x3f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  lVar7 = (uVar4 ^ 0xffffffffffffffc0) + 0x41;
  if (uVar5 == 0) {
    lVar7 = 0;
  }
  if (uVar8 < 2) {
    uVar4 = *storage_ix;
    uVar8 = uVar4 + 4;
    *(ulong *)(storage + (uVar4 >> 3)) = (ulong)storage[uVar4 >> 3] | 1L << ((byte)uVar4 & 7);
    *storage_ix = uVar8;
    *(size_t *)(storage + (uVar8 >> 3)) =
         local_68[0] << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
    *storage_ix = uVar4 + lVar7 + 4;
    depth[local_68[0]] = '\0';
    bits[local_68[0]] = 0;
    return;
  }
  local_40 = storage;
  local_48 = storage_ix;
  local_38 = tree;
  memset(depth,0,histogram_length);
  tree_00 = local_38;
  BrotliCreateHuffmanTree(histogram,histogram_length,0xf,local_38,depth);
  BrotliConvertBitDepthsToSymbols(depth,histogram_length,bits);
  if (4 < uVar8) {
    BrotliStoreHuffmanTree(depth,histogram_length,tree_00,local_48,local_40);
    return;
  }
  uVar5 = *local_48;
  *(ulong *)(local_40 + (uVar5 >> 3)) = (ulong)local_40[uVar5 >> 3] | 1L << ((byte)uVar5 & 7);
  uVar4 = uVar5 + 2;
  *local_48 = uVar4;
  *(ulong *)(local_40 + (uVar4 >> 3)) = uVar8 - 1 << ((byte)uVar4 & 7) | (ulong)local_40[uVar4 >> 3]
  ;
  uVar5 = uVar5 + 4;
  *local_48 = uVar5;
  uVar4 = 0;
  do {
    uVar3 = uVar4 + 1;
    if (uVar3 < uVar8) {
      sVar2 = local_68[uVar4];
      uVar6 = uVar3;
      do {
        sVar1 = local_68[uVar6];
        if (depth[sVar1] < depth[sVar2]) {
          local_68[uVar6] = sVar2;
          local_68[uVar4] = sVar1;
          sVar2 = sVar1;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < uVar8);
    }
    uVar4 = uVar3;
  } while (uVar3 != uVar8);
  uVar3 = local_68[0] << ((byte)uVar5 & 7);
  uVar4 = uVar5 >> 3;
  uVar5 = uVar5 + lVar7;
  if (uVar8 == 3) {
    *(ulong *)(local_40 + uVar4) = uVar3 | local_40[uVar4];
    *local_48 = uVar5;
    *(size_t *)(local_40 + (uVar5 >> 3)) =
         local_68[1] << ((byte)uVar5 & 7) | (ulong)local_40[uVar5 >> 3];
    uVar5 = uVar5 + lVar7;
    *local_48 = uVar5;
    local_68[1] = local_68[2];
  }
  else {
    if (uVar8 != 2) {
      *(ulong *)(local_40 + uVar4) = uVar3 | local_40[uVar4];
      *local_48 = uVar5;
      *(size_t *)(local_40 + (uVar5 >> 3)) =
           local_68[1] << ((byte)uVar5 & 7) | (ulong)local_40[uVar5 >> 3];
      uVar5 = uVar5 + lVar7;
      *local_48 = uVar5;
      *(size_t *)(local_40 + (uVar5 >> 3)) =
           local_68[2] << ((byte)uVar5 & 7) | (ulong)local_40[uVar5 >> 3];
      uVar5 = uVar5 + lVar7;
      *local_48 = uVar5;
      *(size_t *)(local_40 + (uVar5 >> 3)) =
           local_68[3] << ((byte)uVar5 & 7) | (ulong)local_40[uVar5 >> 3];
      uVar8 = uVar5 + lVar7;
      *local_48 = uVar8;
      *(ulong *)(local_40 + (uVar8 >> 3)) =
           (ulong)(depth[local_68[0]] == '\x01') << ((byte)uVar8 & 7) | (ulong)local_40[uVar8 >> 3];
      sVar2 = lVar7 + uVar5 + 1;
      goto LAB_0011dd9e;
    }
    *(ulong *)(local_40 + uVar4) = uVar3 | local_40[uVar4];
    *local_48 = uVar5;
  }
  *(size_t *)(local_40 + (uVar5 >> 3)) =
       local_68[1] << ((byte)uVar5 & 7) | (ulong)local_40[uVar5 >> 3];
  sVar2 = lVar7 + uVar5;
LAB_0011dd9e:
  *local_48 = sVar2;
  return;
}

Assistant:

static void BuildAndStoreHuffmanTree(const uint32_t* histogram,
                                     const size_t histogram_length,
                                     const size_t alphabet_size,
                                     HuffmanTree* tree,
                                     uint8_t* depth,
                                     uint16_t* bits,
                                     size_t* storage_ix,
                                     uint8_t* storage) {
  size_t count = 0;
  size_t s4[4] = { 0 };
  size_t i;
  size_t max_bits = 0;
  for (i = 0; i < histogram_length; i++) {
    if (histogram[i]) {
      if (count < 4) {
        s4[count] = i;
      } else if (count > 4) {
        break;
      }
      count++;
    }
  }

  {
    size_t max_bits_counter = alphabet_size - 1;
    while (max_bits_counter) {
      max_bits_counter >>= 1;
      ++max_bits;
    }
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, s4[0], storage_ix, storage);
    depth[s4[0]] = 0;
    bits[s4[0]] = 0;
    return;
  }

  memset(depth, 0, histogram_length * sizeof(depth[0]));
  BrotliCreateHuffmanTree(histogram, histogram_length, 15, tree, depth);
  BrotliConvertBitDepthsToSymbols(depth, histogram_length, bits);

  if (count <= 4) {
    StoreSimpleHuffmanTree(depth, s4, count, max_bits, storage_ix, storage);
  } else {
    BrotliStoreHuffmanTree(depth, histogram_length, tree, storage_ix, storage);
  }
}